

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::createYieldNode(Parser *this,Token *t,Node *optional_result)

{
  Node *this_00;
  Node *optional_result_local;
  
  optional_result_local = optional_result;
  this_00 = (Node *)operator_new(0x30);
  Node::Node(this_00,this->ctx,t);
  this_00->nodeType = PNT_YIELD;
  if (optional_result != (Node *)0x0) {
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              (&this_00->children,&optional_result_local);
  }
  return this_00;
}

Assistant:

Node * createYieldNode(Token & t, Node * optional_result)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_YIELD;
    if (optional_result)
      n->children.push_back(optional_result);
    return n;
  }